

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void VmExtractOptArgValue
               (jx9_value *pArray,jx9_value *pWorker,char *zArg,char *zArgEnd,int need_val,
               jx9_context *pCtx,char *zName)

{
  char cVar1;
  ushort **ppuVar2;
  jx9_value *pArray_00;
  int nLen;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  
  jx9_value_bool(pWorker,0);
  if (need_val == 0) {
LAB_00128b75:
    jx9_array_add_strkey_elem(pArray,zName,pWorker);
    return;
  }
  pcVar4 = zArg + 1;
  if ((pcVar4 < zArgEnd) && (zArg[1] == '=')) {
    pcVar4 = zArg + 2;
  }
  while( true ) {
    if (zArgEnd <= pcVar4) goto LAB_00128b75;
    cVar1 = *pcVar4;
    if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
       (ppuVar2 = __ctype_b_loc(), (*(byte *)((long)*ppuVar2 + (long)cVar1 * 2 + 1) & 0x20) == 0))
    break;
    pcVar4 = pcVar4 + 1;
  }
  if ((cVar1 == '\"') || (cVar1 == '\'')) {
    nLen = 0;
    for (pcVar3 = pcVar4 + 1; (pcVar3 < zArgEnd && ((*pcVar3 != cVar1 || (pcVar3[-1] == '\\'))));
        pcVar3 = pcVar3 + 1) {
      nLen = nLen + 1;
    }
    jx9_value_string(pWorker,pcVar4 + 1,nLen);
    pcVar3 = pcVar3 + (pcVar3 < zArgEnd);
  }
  else {
    if (cVar1 == '-') goto LAB_00128b75;
    lVar5 = 0;
    while ((pcVar3 = pcVar4 + lVar5, pcVar3 < zArgEnd &&
           (ppuVar2 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar2 + (long)*pcVar3 * 2 + 1) & 0x20) == 0))) {
      lVar5 = lVar5 + 1;
    }
    jx9_value_string(pWorker,pcVar4,(int)lVar5);
  }
  while( true ) {
    if (zArgEnd <= pcVar3) goto LAB_00128b75;
    cVar1 = *pcVar3;
    if (0xffffffffffffffbf < (ulong)(long)cVar1) break;
    ppuVar2 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar2 + (long)cVar1 * 2 + 1) & 0x20) == 0) {
      if (cVar1 == '-') goto LAB_00128b75;
      break;
    }
    pcVar3 = pcVar3 + 1;
  }
  pArray_00 = jx9_context_new_array(pCtx);
  if (pArray_00 != (jx9_value *)0x0) {
    jx9_array_add_elem(pArray_00,(jx9_value *)0x0,pWorker);
    while ((pcVar3 < zArgEnd && (*pcVar3 != '-'))) {
      pcVar4 = pcVar3 + (*pcVar3 == '\\');
      lVar5 = 0;
      while ((pcVar3 = pcVar4 + lVar5, pcVar3 < zArgEnd &&
             (ppuVar2 = __ctype_b_loc(),
             (*(byte *)((long)*ppuVar2 + (long)*pcVar3 * 2 + 1) & 0x20) == 0))) {
        lVar5 = lVar5 + 1;
      }
      SyBlobReset(&pWorker->sBlob);
      jx9_value_string(pWorker,pcVar4,(int)lVar5);
      jx9_array_add_elem(pArray_00,(jx9_value *)0x0,pWorker);
      while (((pcVar3 < zArgEnd && (cVar1 = *pcVar3, (ulong)(long)cVar1 < 0xffffffffffffffc0)) &&
             (ppuVar2 = __ctype_b_loc(),
             (*(byte *)((long)*ppuVar2 + (long)cVar1 * 2 + 1) & 0x20) != 0))) {
        pcVar3 = pcVar3 + 1;
      }
    }
    jx9_array_add_strkey_elem(pArray,zName,pArray_00);
    jx9_context_release_value(pCtx,pArray_00);
    return;
  }
  jx9_context_throw_error(pCtx,1,"JX9 is running out of memory");
  return;
}

Assistant:

static void VmExtractOptArgValue(
	jx9_value *pArray,  /* getopt() return value */
	jx9_value *pWorker, /* Worker variable */
	const char *zArg,   /* Argument stream */
	const char *zArgEnd, /* End of the argument stream  */
	int need_val,       /* TRUE to fetch option argument */
	jx9_context *pCtx,  /* Call Context */
	const char *zName   /* Option name */)
{
	jx9_value_bool(pWorker, 0);
	if( !need_val ){
		/* 
		 * Option does not need arguments.
		 * Insert the option name and a boolean FALSE.
		 */
		jx9_array_add_strkey_elem(pArray, (const char *)zName, pWorker); /* Will make it's own copy */
	}else{
		const char *zCur;
		/* Extract option argument */
		zArg++;
		if( zArg < zArgEnd && zArg[0] == '=' ){
			zArg++;
		}
		while( zArg < zArgEnd && (unsigned char)zArg[0] < 0xc0 && SyisSpace(zArg[0]) ){
			zArg++;
		}
		if( zArg >= zArgEnd || zArg[0] == '-' ){
			/*
			 * Argument not found.
			 * Insert the option name and a boolean FALSE.
			 */
			jx9_array_add_strkey_elem(pArray, (const char *)zName, pWorker); /* Will make it's own copy */
			return;
		}
		/* Delimit the value */
		zCur = zArg;
		if( zArg[0] == '\'' || zArg[0] == '"' ){
			int d = zArg[0];
			/* Delimt the argument */
			zArg++;
			zCur = zArg;
			while( zArg < zArgEnd ){
				if( zArg[0] == d && zArg[-1] != '\\' ){
					/* Delimiter found, exit the loop  */
					break;
				}
				zArg++;
			}
			/* Save the value */
			jx9_value_string(pWorker, zCur, (int)(zArg-zCur));
			if( zArg < zArgEnd ){ zArg++; }
		}else{
			while( zArg < zArgEnd && !SyisSpace(zArg[0]) ){
				zArg++;
			}
			/* Save the value */
			jx9_value_string(pWorker, zCur, (int)(zArg-zCur));
		}
		/*
		 * Check if we are dealing with multiple values.
		 * If so, create an array to hold them, rather than a scalar variable.
		 */
		while( zArg < zArgEnd && (unsigned char)zArg[0] < 0xc0 && SyisSpace(zArg[0]) ){
			zArg++;
		}
		if( zArg < zArgEnd && zArg[0] != '-' ){
			jx9_value *pOptArg; /* Array of option arguments */
			pOptArg = jx9_context_new_array(pCtx);
			if( pOptArg == 0 ){
				jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
			}else{
				/* Insert the first value */
				jx9_array_add_elem(pOptArg, 0, pWorker); /* Will make it's own copy */
				for(;;){
					if( zArg >= zArgEnd || zArg[0] == '-' ){
						/* No more value */
						break;
					}
					/* Delimit the value */
					zCur = zArg;
					if( zArg < zArgEnd && zArg[0] == '\\' ){
						zArg++;
						zCur = zArg;
					}
					while( zArg < zArgEnd && !SyisSpace(zArg[0]) ){
						zArg++;
					}
					/* Reset the string cursor */
					jx9_value_reset_string_cursor(pWorker);
					/* Save the value */
					jx9_value_string(pWorker, zCur, (int)(zArg-zCur));
					/* Insert */
					jx9_array_add_elem(pOptArg, 0, pWorker); /* Will make it's own copy */
					/* Jump trailing white spaces */
					while( zArg < zArgEnd && (unsigned char)zArg[0] < 0xc0 && SyisSpace(zArg[0]) ){
						zArg++;
					}
				}
				/* Insert the option arg array */
				jx9_array_add_strkey_elem(pArray, (const char *)zName, pOptArg); /* Will make it's own copy */
				/* Safely release */
				jx9_context_release_value(pCtx, pOptArg);
			}
		}else{
			/* Single value */
			jx9_array_add_strkey_elem(pArray, (const char *)zName, pWorker); /* Will make it's own copy */
		}
	}
}